

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::InvocationInterlockPlacementPass::Process(InvocationInterlockPlacementPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer puVar5;
  size_type sVar6;
  size_type sVar7;
  Function *entry_func;
  byte bVar8;
  Status SVar9;
  Instruction *pIVar10;
  uint uVar11;
  Module *pMVar12;
  Instruction *entry_inst;
  Instruction *pIVar13;
  Function *func;
  unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
  entry_points;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_80;
  _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_78;
  Function *local_70;
  undefined1 local_68 [40];
  _func_int **local_40;
  Instruction *pIStack_38;
  
  bVar3 = isFragmentShaderInterlockEnabled(this);
  SVar9 = SuccessWithoutChange;
  if (bVar3) {
    local_68._0_8_ = &pIStack_38;
    local_68._8_8_ = (pointer)0x1;
    local_68._16_8_ = (_Hash_node_base *)0x0;
    local_68._24_8_ = (pointer)0x0;
    local_68._32_4_ = 1.0;
    local_40 = (_func_int **)0x0;
    pIStack_38 = (Instruction *)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar13 = *(Instruction **)
               ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar10 = (Instruction *)
              ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar13 != pIVar10) {
      do {
        uVar11 = (pIVar13->has_result_id_ & 1) + 1;
        if (pIVar13->has_type_id_ == false) {
          uVar11 = (uint)pIVar13->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(pIVar13,uVar11 + 1);
        local_70 = IRContext::GetFunction((this->super_Pass).context_,uVar4);
        local_80._M_head_impl = (Function *)local_68;
        std::
        _Hashtable<spvtools::opt::Function*,spvtools::opt::Function*,std::allocator<spvtools::opt::Function*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Function*>,std::hash<spvtools::opt::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Function*,false>>>>
                  ((_Hashtable<spvtools::opt::Function*,spvtools::opt::Function*,std::allocator<spvtools::opt::Function*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Function*>,std::hash<spvtools::opt::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_68,&local_70,&local_80);
        pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar13 != pIVar10);
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar2 = *(pointer *)
              &(pMVar1->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl;
    if (puVar2 == *(pointer *)
                   ((long)&(pMVar1->functions_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                   + 8)) {
      bVar8 = 0;
      pMVar12 = pMVar1;
    }
    else {
      local_78 = &(this->extracted_functions_)._M_h;
      bVar8 = 0;
      puVar2 = puVar2 + 1;
      do {
        puVar5 = puVar2;
        local_80._M_head_impl =
             *(Function **)
              &puVar5[-1]._M_t.
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        ;
        recordBeginOrEndInFunction(this,local_80._M_head_impl);
        sVar6 = std::
                _Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_68,&local_80._M_head_impl);
        if ((sVar6 == 0) &&
           (sVar7 = std::
                    _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::count(local_78,&local_80._M_head_impl), sVar7 != 0)) {
          bVar3 = removeBeginAndEndInstructionsFromFunction(this,local_80._M_head_impl);
          bVar8 = bVar8 | bVar3;
        }
        pMVar12 = (((this->super_Pass).context_)->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        puVar2 = puVar5 + 1;
      } while ((pMVar1 != pMVar12) ||
              (puVar5 != *(pointer *)
                          ((long)&(pMVar12->functions_).
                                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                                  ._M_impl + 8)));
    }
    for (pIVar13 = *(Instruction **)
                    ((long)&(pMVar12->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>
                            .sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
        pIVar13 !=
        &(pMVar12->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      uVar11 = (pIVar13->has_result_id_ & 1) + 1;
      if (pIVar13->has_type_id_ == false) {
        uVar11 = (uint)pIVar13->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(pIVar13,uVar11 + 1);
      entry_func = IRContext::GetFunction((this->super_Pass).context_,uVar4);
      uVar4 = (pIVar13->has_result_id_ & 1) + 1;
      if (pIVar13->has_type_id_ == false) {
        uVar4 = (uint)pIVar13->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(pIVar13,uVar4);
      if (uVar4 == 4) {
        bVar3 = processFragmentShaderEntry(this,entry_func);
        bVar8 = bVar8 | bVar3;
      }
    }
    SVar9 = bVar8 ^ SuccessWithoutChange;
    std::
    _Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
  }
  return SVar9;
}

Assistant:

Pass::Status InvocationInterlockPlacementPass::Process() {
  // Skip this pass if the necessary extension or capability is missing
  if (!isFragmentShaderInterlockEnabled()) {
    return Status::SuccessWithoutChange;
  }

  bool modified = false;

  std::unordered_set<Function*> entry_points;
  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    entry_points.insert(context()->GetFunction(entry_id));
  }

  for (auto fi = context()->module()->begin(); fi != context()->module()->end();
       ++fi) {
    Function* func = &*fi;
    recordBeginOrEndInFunction(func);
    if (!entry_points.count(func) && extracted_functions_.count(func)) {
      modified |= removeBeginAndEndInstructionsFromFunction(func);
    }
  }

  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    Function* entry_func = context()->GetFunction(entry_id);

    auto execution_model = spv::ExecutionModel(
        entry_inst.GetSingleWordInOperand(kEntryPointExecutionModelInIdx));

    if (execution_model != spv::ExecutionModel::Fragment) {
      continue;
    }

    modified |= processFragmentShaderEntry(entry_func);
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}